

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall
pbrt::BinaryWriter::write<std::__cxx11::string,pbrt::Texture>
          (BinaryWriter *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
          *values)

{
  _Base_ptr p_Var1;
  size_t in_RCX;
  void *__buf;
  int32_t size;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>
  it;
  int local_74;
  __shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>
  local_60;
  
  local_74 = (int)(values->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  write<int>(this,&local_74);
  for (p_Var1 = (values->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(values->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>
    ::pair(&local_60,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>
            *)(p_Var1 + 1));
    write(this,(int)&local_60,__buf,in_RCX);
    std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,
               &local_60.second.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>);
    write<pbrt::Texture>(this,(shared_ptr<pbrt::Texture> *)&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>
    ::~pair(&local_60);
  }
  return;
}

Assistant:

void write(const std::map<T1,std::shared_ptr<T2>> &values)
    {
      int32_t size = (int32_t)values.size();
      write(size);
      for (auto it : values) {
        write(it.first);
        write(it.second);
        // write(serialize(it.second));
      }
    }